

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O0

error_logger_for_timertt_t * __thiscall
so_5::timers_details::create_error_logger_for_timertt_abi_cxx11_
          (error_logger_for_timertt_t *__return_storage_ptr__,timers_details *this,
          error_logger_shptr_t *logger)

{
  anon_class_16_1_5fbbe6ce local_28;
  timers_details *local_18;
  error_logger_shptr_t *logger_local;
  
  local_18 = this;
  logger_local = (error_logger_shptr_t *)__return_storage_ptr__;
  std::shared_ptr<so_5::error_logger_t>::shared_ptr
            (&local_28.logger,(shared_ptr<so_5::error_logger_t> *)this);
  std::function<void(std::__cxx11::string_const&)>::
  function<so_5::timers_details::create_error_logger_for_timertt(std::shared_ptr<so_5::error_logger_t>)::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)__return_storage_ptr__,&local_28);
  create_error_logger_for_timertt[abi:cxx11](std::shared_ptr<so_5::error_logger_t>)::$_0::~__0
            ((__0 *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

error_logger_for_timertt_t
create_error_logger_for_timertt( error_logger_shptr_t logger )
	{
		return [logger]( const std::string & msg ) {
			SO_5_LOG_ERROR( *logger, stream ) {
				stream << "error inside timer_thread: " << msg;
			}
		};
	}